

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermission.cpp
# Opt level: O1

void __thiscall
DIntermissionScreenScroller::Init
          (DIntermissionScreenScroller *this,FIntermissionAction *desc,bool first)

{
  FTextureID FVar1;
  
  DIntermissionScreen::Init(&this->super_DIntermissionScreen,desc,first);
  (this->mFirstPic).texnum = (this->super_DIntermissionScreen).mBackground.texnum;
  FVar1 = FTextureManager::CheckForTexture(&TexMan,(char *)desc[1]._vptr_FIntermissionAction,8,1);
  (this->mSecondPic).texnum = FVar1.texnum;
  this->mScrollDelay = desc[1].mSize;
  this->mScrollTime = *(int *)&desc[1].field_0xc;
  this->mScrollDir = *(int *)&desc[1].mClass;
  return;
}

Assistant:

void DIntermissionScreenScroller::Init(FIntermissionAction *desc, bool first)
{
	Super::Init(desc, first);
	mFirstPic = mBackground;
	mSecondPic = TexMan.CheckForTexture(static_cast<FIntermissionActionScroller*>(desc)->mSecondPic, FTexture::TEX_MiscPatch);
	mScrollDelay = static_cast<FIntermissionActionScroller*>(desc)->mScrollDelay;
	mScrollTime = static_cast<FIntermissionActionScroller*>(desc)->mScrollTime;
	mScrollDir = static_cast<FIntermissionActionScroller*>(desc)->mScrollDir;
}